

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-check.c
# Opt level: O0

int check_data(coda_cursor *cursor,coda_type **definition,int read_check,int size_check,
              int64_t *bit_size,_func_void_coda_cursor_ptr_char_ptr_void_ptr *callbackfunc,
              void *userdata)

{
  coda_expression *pcVar1;
  _func_void_coda_cursor_ptr_char_ptr_void_ptr *p_Var2;
  coda_type **ppcVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  undefined4 *puVar8;
  long lVar9;
  void *dst;
  size_t sVar10;
  coda_type *local_760;
  coda_type *local_740;
  char local_708 [8];
  char s2_1 [30];
  char s1_1 [30];
  char error_message_1 [256];
  long i_2;
  char *data_2;
  int64_t byte_size_1;
  long offset;
  int64_t calculated_bit_size;
  int64_t expected_byte_size;
  coda_type *base_definition_1;
  char local_588 [4];
  coda_special_type special_type_1;
  char s2 [30];
  char s1 [30];
  char error_message [256];
  uint uStack_438;
  int prev_option_value;
  int64_t fast_size;
  long index;
  char *field_name;
  coda_type *pcStack_418;
  int available;
  coda_type *field_definition;
  long i_1;
  long num_elements_1;
  coda_cursor record_cursor;
  double *values;
  coda_format array_element_type_format;
  coda_type_class array_element_type_class;
  coda_type *array_element_type;
  long i;
  long num_elements;
  coda_type *base_definition;
  int64_t sub_bit_size;
  int64_t attribute_size;
  coda_type *attributes_definition;
  double value_1;
  uint8_t *puStack_98;
  coda_special_type special_type;
  uint8_t *data_1;
  long fixed_value_length_1;
  char *fixed_value_1;
  int64_t byte_size;
  long fixed_value_length;
  char *fixed_value;
  long string_length;
  char *data;
  double value;
  coda_type *type;
  int local_40;
  int has_attributes;
  int skip_mem_size_check;
  coda_type_class type_class;
  _func_void_coda_cursor_ptr_char_ptr_void_ptr *callbackfunc_local;
  int64_t *bit_size_local;
  int size_check_local;
  int read_check_local;
  coda_type **definition_local;
  coda_cursor *cursor_local;
  
  local_40 = 0;
  _skip_mem_size_check = callbackfunc;
  callbackfunc_local = (_func_void_coda_cursor_ptr_char_ptr_void_ptr *)bit_size;
  bit_size_local._0_4_ = size_check;
  bit_size_local._4_4_ = read_check;
  _size_check_local = definition;
  definition_local = (coda_type **)cursor;
  if (bit_size == (int64_t *)0x0) {
    __assert_fail("bit_size != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                  ,0x132,
                  "int check_data(coda_cursor *, coda_type **, int, int, int64_t *, void (*)(coda_cursor *, const char *, void *), void *)"
                 );
  }
  iVar4 = coda_cursor_get_type(cursor,(coda_type **)&value);
  if (iVar4 != 0) {
    return -1;
  }
  iVar4 = coda_type_get_class((coda_type *)value,(coda_type_class *)&has_attributes);
  if (iVar4 != 0) {
    return -1;
  }
  iVar4 = check_definition((coda_cursor *)definition_local,_size_check_local,_skip_mem_size_check,
                           userdata);
  if (iVar4 != 0) {
    return -1;
  }
  if ((int)bit_size_local == 0) goto LAB_0012dc08;
  if (1 < (uint)has_attributes) {
    if (has_attributes - 2U < 4) {
      iVar4 = coda_cursor_get_bit_size
                        ((coda_cursor *)definition_local,(int64_t *)callbackfunc_local);
      if (iVar4 != 0) {
        return -1;
      }
      goto LAB_0012dc08;
    }
    if (has_attributes != 6) goto LAB_0012dc08;
  }
  *(undefined8 *)callbackfunc_local = 0;
LAB_0012dc08:
  if (bit_size_local._4_4_ != 0) {
    switch(has_attributes) {
    case 0:
    case 1:
      break;
    case 2:
    case 3:
      iVar4 = coda_cursor_read_double((coda_cursor *)definition_local,(double *)&data);
      if (iVar4 != 0) {
        piVar6 = (int *)__tls_get_addr(&PTR_00246fb8);
        if (((*piVar6 != -300) && (piVar6 = (int *)__tls_get_addr(&PTR_00246fb8), *piVar6 != -0x67))
           && (piVar6 = (int *)__tls_get_addr(&PTR_00246fb8), *piVar6 != -0x68)) {
          return -1;
        }
        ppcVar3 = definition_local;
        p_Var2 = _skip_mem_size_check;
        piVar6 = (int *)__tls_get_addr(&PTR_00246fb8);
        pcVar7 = coda_errno_to_string(*piVar6);
        (*p_Var2)((coda_cursor *)ppcVar3,pcVar7,userdata);
      }
      break;
    case 4:
      string_length = 0;
      iVar4 = coda_cursor_get_string_length((coda_cursor *)definition_local,(long *)&fixed_value);
      if (iVar4 == 0) {
        if ((long)fixed_value < 0) {
          (*_skip_mem_size_check)
                    ((coda_cursor *)definition_local,"string length is negative",userdata);
          local_40 = 1;
        }
        else {
          if (*_size_check_local == (coda_type *)0x0) {
            local_740 = (coda_type *)value;
          }
          else {
            local_740 = *_size_check_local;
          }
          iVar4 = coda_type_get_fixed_value(local_740,(char **)&fixed_value_length,&byte_size);
          if (iVar4 != 0) {
            return -1;
          }
          if (0 < (long)fixed_value) {
            string_length = (long)malloc((size_t)(fixed_value + 1));
            if ((char *)string_length == (char *)0x0) {
              coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                             fixed_value + 1,
                             "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                             ,0x19b);
              return -1;
            }
            iVar4 = coda_cursor_read_string
                              ((coda_cursor *)definition_local,(char *)string_length,
                               (long)(fixed_value + 1));
            if (iVar4 != 0) {
              free((void *)string_length);
              return -1;
            }
          }
          if (fixed_value_length != 0) {
            if (fixed_value == (char *)byte_size) {
              if ((0 < (long)fixed_value) &&
                 (iVar4 = memcmp((void *)string_length,(void *)fixed_value_length,byte_size),
                 iVar4 != 0)) {
                (*_skip_mem_size_check)
                          ((coda_cursor *)definition_local,"string data does not match fixed value",
                           userdata);
              }
            }
            else {
              (*_skip_mem_size_check)
                        ((coda_cursor *)definition_local,
                         "string data does not match fixed value (length differs)",userdata);
            }
          }
          if (*(int *)((long)value + 0x40) == 1) {
            switch(*(undefined4 *)&(*definition_local)[1].description) {
            case 0:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                            ,0x1ce,
                            "int check_data(coda_cursor *, coda_type **, int, int, int64_t *, void (*)(coda_cursor *, const char *, void *), void *)"
                           );
            case 1:
              if ((fixed_value != (char *)0x1) || (*(char *)string_length != '\n')) {
                (*_skip_mem_size_check)
                          ((coda_cursor *)definition_local,
                           "invalid end of line sequence (expected newline)",userdata);
              }
              break;
            case 2:
              if ((fixed_value != (char *)0x1) || (*(char *)string_length != '\r')) {
                (*_skip_mem_size_check)
                          ((coda_cursor *)definition_local,
                           "invalid end of line sequence (expected carriage return)",userdata);
              }
              break;
            case 3:
              if (((fixed_value != (char *)0x2) || (*(char *)string_length != '\r')) ||
                 (*(char *)(string_length + 1) != '\n')) {
                (*_skip_mem_size_check)
                          ((coda_cursor *)definition_local,
                           "invalid end of line sequence (expected carriage return followed by newline)"
                           ,userdata);
              }
            }
          }
          if (string_length != 0) {
            free((void *)string_length);
          }
        }
      }
      else {
        piVar6 = (int *)__tls_get_addr(&PTR_00246fb8);
        if (((*piVar6 != -300) && (piVar6 = (int *)__tls_get_addr(&PTR_00246fb8), *piVar6 != -0x67))
           && (piVar6 = (int *)__tls_get_addr(&PTR_00246fb8), *piVar6 != -0x68)) {
          return -1;
        }
        ppcVar3 = definition_local;
        p_Var2 = _skip_mem_size_check;
        piVar6 = (int *)__tls_get_addr(&PTR_00246fb8);
        pcVar7 = coda_errno_to_string(*piVar6);
        (*p_Var2)((coda_cursor *)ppcVar3,pcVar7,userdata);
        local_40 = 1;
      }
      break;
    case 5:
      if (((int)bit_size_local == 0) &&
         (iVar4 = coda_cursor_get_bit_size
                            ((coda_cursor *)definition_local,(int64_t *)callbackfunc_local),
         iVar4 != 0)) {
        piVar6 = (int *)__tls_get_addr(&PTR_00246fb8);
        if (((*piVar6 != -300) && (piVar6 = (int *)__tls_get_addr(&PTR_00246fb8), *piVar6 != -0x67))
           && (piVar6 = (int *)__tls_get_addr(&PTR_00246fb8), *piVar6 != -0x68)) {
          return -1;
        }
        ppcVar3 = definition_local;
        p_Var2 = _skip_mem_size_check;
        piVar6 = (int *)__tls_get_addr(&PTR_00246fb8);
        pcVar7 = coda_errno_to_string(*piVar6);
        (*p_Var2)((coda_cursor *)ppcVar3,pcVar7,userdata);
        local_40 = 1;
      }
      else if (*(long *)callbackfunc_local < 0) {
        (*_skip_mem_size_check)((coda_cursor *)definition_local,"bit size is negative",userdata);
        local_40 = 1;
      }
      else {
        fixed_value_1 =
             (char *)((*(long *)callbackfunc_local >> 3) +
                     (long)(int)(uint)((*(ulong *)callbackfunc_local & 7) != 0));
        if (*_size_check_local == (coda_type *)0x0) {
          local_760 = (coda_type *)value;
        }
        else {
          local_760 = *_size_check_local;
        }
        iVar4 = coda_type_get_fixed_value(local_760,(char **)&fixed_value_length_1,(long *)&data_1);
        if (iVar4 != 0) {
          return -1;
        }
        if (fixed_value_length_1 != 0) {
          if ((uint8_t *)fixed_value_1 == data_1) {
            if (0 < (long)data_1) {
              puStack_98 = (uint8_t *)malloc((size_t)fixed_value_1);
              if (puStack_98 == (uint8_t *)0x0) {
                coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                               fixed_value_1,
                               "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                               ,0x20c);
                return -1;
              }
              iVar4 = coda_cursor_read_bits
                                ((coda_cursor *)definition_local,puStack_98,0,
                                 *(int64_t *)callbackfunc_local);
              if (iVar4 != 0) {
                free(puStack_98);
                return -1;
              }
              iVar4 = memcmp(puStack_98,(void *)fixed_value_length_1,(size_t)data_1);
              if (iVar4 != 0) {
                (*_skip_mem_size_check)
                          ((coda_cursor *)definition_local,
                           "data does not match fixed value (value differs)",userdata);
              }
              free(puStack_98);
            }
          }
          else {
            (*_skip_mem_size_check)
                      ((coda_cursor *)definition_local,
                       "data does not match fixed value (length differs)",userdata);
          }
        }
      }
      break;
    case 6:
      iVar4 = coda_cursor_get_special_type
                        ((coda_cursor *)definition_local,(coda_special_type *)((long)&value_1 + 4));
      if (iVar4 != 0) {
        return -1;
      }
      if ((value_1._4_4_ == 2) &&
         (iVar4 = coda_cursor_read_double
                            ((coda_cursor *)definition_local,(double *)&attributes_definition),
         iVar4 != 0)) {
        piVar6 = (int *)__tls_get_addr(&PTR_00246fb8);
        if ((*piVar6 != -300) &&
           ((piVar6 = (int *)__tls_get_addr(&PTR_00246fb8), *piVar6 != -0x67 &&
            (piVar6 = (int *)__tls_get_addr(&PTR_00246fb8), *piVar6 != -0x68)))) {
          return -1;
        }
        ppcVar3 = definition_local;
        p_Var2 = _skip_mem_size_check;
        piVar6 = (int *)__tls_get_addr(&PTR_00246fb8);
        pcVar7 = coda_errno_to_string(*piVar6);
        (*p_Var2)((coda_cursor *)ppcVar3,pcVar7,userdata);
      }
    }
  }
  iVar4 = coda_cursor_has_attributes((coda_cursor *)definition_local,(int *)((long)&type + 4));
  if (iVar4 != 0) {
    return -1;
  }
  if (type._4_4_ != 0) {
    attribute_size = 0;
    if ((*_size_check_local != (coda_type *)0x0) &&
       (iVar4 = coda_type_get_attributes(*_size_check_local,(coda_type **)&attribute_size),
       iVar4 != 0)) {
      return -1;
    }
    iVar4 = coda_cursor_goto_attributes((coda_cursor *)definition_local);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = check_data((coda_cursor *)definition_local,(coda_type **)&attribute_size,
                       bit_size_local._4_4_,0,&sub_bit_size,_skip_mem_size_check,userdata);
    if (iVar4 != 0) {
      return -1;
    }
    coda_cursor_goto_parent((coda_cursor *)definition_local);
    if ((*_size_check_local != (coda_type *)0x0) && (attribute_size == 0)) {
      *_size_check_local = (coda_type *)0x0;
    }
  }
  if (((*_size_check_local != (coda_type *)0x0) || (bit_size_local._4_4_ != 0)) ||
     ((int)bit_size_local != 0)) {
    switch(has_attributes) {
    case 0:
      memcpy(&num_elements_1,definition_local,0x310);
      iVar4 = coda_cursor_get_num_elements((coda_cursor *)&num_elements_1,&i_1);
      if (iVar4 != 0) {
        return -1;
      }
      if (0 < i_1) {
        iVar4 = coda_cursor_goto_first_record_field((coda_cursor *)definition_local);
        if (iVar4 != 0) {
          return -1;
        }
        for (field_definition = (coda_type *)0x0; (long)field_definition < i_1;
            field_definition = (coda_type *)((long)&field_definition->format + 1)) {
          pcStack_418 = (coda_type *)0x0;
          iVar4 = coda_cursor_get_record_field_available_status
                            ((coda_cursor *)&num_elements_1,(long)field_definition,
                             (int *)((long)&field_name + 4));
          if (iVar4 != 0) {
            return -1;
          }
          if (field_name._4_4_ != 0) {
            if (*_size_check_local != (coda_type *)0x0) {
              iVar4 = coda_type_get_record_field_name
                                ((coda_type *)value,(long)field_definition,(char **)&index);
              if (iVar4 != 0) {
                return -1;
              }
              iVar4 = coda_type_get_record_field_index_from_name
                                (*_size_check_local,(char *)index,&fast_size);
              if (iVar4 == 0) {
                iVar4 = coda_type_get_record_field_type
                                  (*_size_check_local,fast_size,&stack0xfffffffffffffbe8);
                if (iVar4 != 0) {
                  return -1;
                }
              }
              else {
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_00246fb8);
                *puVar8 = 0;
              }
            }
            iVar4 = check_data((coda_cursor *)definition_local,&stack0xfffffffffffffbe8,
                               bit_size_local._4_4_,(int)bit_size_local,(int64_t *)&base_definition,
                               _skip_mem_size_check,userdata);
            if (iVar4 != 0) {
              return -1;
            }
            if ((int)bit_size_local != 0) {
              *(long *)callbackfunc_local =
                   (long)&base_definition->format + *(long *)callbackfunc_local;
            }
          }
          if (((long)field_definition < i_1 + -1) &&
             (iVar4 = coda_cursor_goto_next_record_field((coda_cursor *)definition_local),
             iVar4 != 0)) {
            return -1;
          }
        }
        coda_cursor_goto_parent((coda_cursor *)definition_local);
      }
      if (((int)bit_size_local != 0) && (*(long *)((long)value + 0x28) != 0)) {
        iVar4 = coda_get_option_use_fast_size_expressions();
        coda_set_option_use_fast_size_expressions(1);
        iVar5 = coda_cursor_get_bit_size
                          ((coda_cursor *)definition_local,(int64_t *)&stack0xfffffffffffffbc8);
        ppcVar3 = definition_local;
        p_Var2 = _skip_mem_size_check;
        if (iVar5 == 0) {
          if (*(ulong *)callbackfunc_local != _uStack_438) {
            coda_str64(*(long *)callbackfunc_local >> 3,s2 + 0x18);
            if ((*(ulong *)callbackfunc_local & 7) != 0) {
              sVar10 = strlen(s2 + 0x18);
              sprintf(s2 + sVar10 + 0x18,":%d",(ulong)((uint)*(undefined8 *)callbackfunc_local & 7))
              ;
            }
            coda_str64((long)_uStack_438 >> 3,local_588);
            if ((_uStack_438 & 7) != 0) {
              sVar10 = strlen(local_588);
              sprintf(local_588 + sVar10,":%d",(ulong)(uStack_438 & 7));
            }
            sprintf(s1 + 0x18,
                    "invalid result for record size expression (actual record size %s does not match expression result %s)"
                    ,s2 + 0x18,local_588);
            (*_skip_mem_size_check)((coda_cursor *)definition_local,s1 + 0x18,userdata);
          }
        }
        else {
          piVar6 = (int *)__tls_get_addr(&PTR_00246fb8);
          pcVar7 = coda_errno_to_string(*piVar6);
          (*p_Var2)((coda_cursor *)ppcVar3,pcVar7,userdata);
          local_40 = 1;
        }
        coda_set_option_use_fast_size_expressions(iVar4);
      }
      break;
    case 1:
      num_elements = 0;
      if ((*_size_check_local != (coda_type *)0x0) &&
         (iVar4 = coda_type_get_array_base_type(*_size_check_local,(coda_type **)&num_elements),
         iVar4 != 0)) {
        return -1;
      }
      iVar4 = coda_cursor_get_num_elements((coda_cursor *)definition_local,&i);
      if (iVar4 != 0) {
        return -1;
      }
      if (0 < i) {
        iVar4 = coda_cursor_goto_first_array_element((coda_cursor *)definition_local);
        if (iVar4 != 0) {
          return -1;
        }
        iVar4 = coda_cursor_get_type
                          ((coda_cursor *)definition_local,(coda_type **)&array_element_type_format)
        ;
        if (iVar4 != 0) {
          return -1;
        }
        iVar4 = coda_type_get_class(_array_element_type_format,
                                    (coda_type_class *)((long)&values + 4));
        if (iVar4 != 0) {
          return -1;
        }
        iVar4 = coda_type_get_format(_array_element_type_format,(coda_format *)&values);
        if (iVar4 != 0) {
          return -1;
        }
        iVar4 = coda_cursor_get_bit_size
                          ((coda_cursor *)definition_local,(int64_t *)&base_definition);
        if (iVar4 != 0) {
          return -1;
        }
        if ((((bit_size_local._4_4_ == 0) || ((int)values != 4)) || (i < 2)) ||
           ((values._4_4_ != 2 && (values._4_4_ != 3)))) {
          for (array_element_type = (coda_type *)0x0; (long)array_element_type < i;
              array_element_type = (coda_type *)((long)&array_element_type->format + 1)) {
            iVar4 = check_data((coda_cursor *)definition_local,(coda_type **)&num_elements,
                               bit_size_local._4_4_,(int)bit_size_local,(int64_t *)&base_definition,
                               _skip_mem_size_check,userdata);
            if (iVar4 != 0) {
              return -1;
            }
            if ((int)bit_size_local != 0) {
              *(long *)callbackfunc_local =
                   (long)&base_definition->format + *(long *)callbackfunc_local;
            }
            if (((long)array_element_type < i + -1) &&
               (iVar4 = coda_cursor_goto_next_array_element((coda_cursor *)definition_local),
               iVar4 != 0)) {
              return -1;
            }
          }
          coda_cursor_goto_parent((coda_cursor *)definition_local);
        }
        else {
          if ((int)bit_size_local != 0) {
            __assert_fail("size_check == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                          ,0x297,
                          "int check_data(coda_cursor *, coda_type **, int, int, int64_t *, void (*)(coda_cursor *, const char *, void *), void *)"
                         );
          }
          iVar4 = check_data((coda_cursor *)definition_local,(coda_type **)&num_elements,0,0,
                             (int64_t *)&base_definition,_skip_mem_size_check,userdata);
          if (iVar4 != 0) {
            return -1;
          }
          coda_cursor_goto_parent((coda_cursor *)definition_local);
          record_cursor.stack[0x1f].bit_offset = (int64_t)malloc(i << 3);
          if ((double *)record_cursor.stack[0x1f].bit_offset == (double *)0x0) {
            coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",i << 3,
                           "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                           ,0x2a5);
            return -1;
          }
          iVar4 = coda_cursor_read_double_array
                            ((coda_cursor *)definition_local,
                             (double *)record_cursor.stack[0x1f].bit_offset,coda_array_ordering_c);
          if (iVar4 != 0) {
            piVar6 = (int *)__tls_get_addr(&PTR_00246fb8);
            if (((*piVar6 != -300) &&
                (piVar6 = (int *)__tls_get_addr(&PTR_00246fb8), *piVar6 != -0x67)) &&
               (piVar6 = (int *)__tls_get_addr(&PTR_00246fb8), *piVar6 != -0x68)) {
              return -1;
            }
            ppcVar3 = definition_local;
            p_Var2 = _skip_mem_size_check;
            piVar6 = (int *)__tls_get_addr(&PTR_00246fb8);
            pcVar7 = coda_errno_to_string(*piVar6);
            (*p_Var2)((coda_cursor *)ppcVar3,pcVar7,userdata);
          }
          free((void *)record_cursor.stack[0x1f].bit_offset);
        }
        if ((*_size_check_local != (coda_type *)0x0) && (num_elements == 0)) {
          *_size_check_local = (coda_type *)0x0;
        }
      }
      break;
    case 2:
    case 3:
    case 4:
    case 5:
      break;
    case 6:
      expected_byte_size = 0;
      iVar4 = coda_cursor_get_special_type
                        ((coda_cursor *)definition_local,
                         (coda_special_type *)((long)&base_definition_1 + 4));
      if (iVar4 != 0) {
        return -1;
      }
      if (base_definition_1._4_4_ == 0) {
        __assert_fail("special_type != coda_special_no_data",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                      ,0x346,
                      "int check_data(coda_cursor *, coda_type **, int, int, int64_t *, void (*)(coda_cursor *, const char *, void *), void *)"
                     );
      }
      if ((*_size_check_local != (coda_type *)0x0) &&
         (iVar4 = coda_type_get_special_base_type
                            (*_size_check_local,(coda_type **)&expected_byte_size), iVar4 != 0)) {
        return -1;
      }
      iVar4 = coda_cursor_use_base_type_of_special_type((coda_cursor *)definition_local);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = check_data((coda_cursor *)definition_local,(coda_type **)&expected_byte_size,
                         bit_size_local._4_4_,(int)bit_size_local,(int64_t *)callbackfunc_local,
                         _skip_mem_size_check,userdata);
      if (iVar4 != 0) {
        return -1;
      }
    }
  }
  if (((((int)bit_size_local != 0) && (local_40 == 0)) &&
      (definition_local[(long)(*(int *)(definition_local + 1) + -1) * 3 + 2]->format == 100)) &&
     (*(int *)&definition_local[(long)(*(int *)(definition_local + 1) + -1) * 3 + 2]->name == 2)) {
    calculated_bit_size =
         definition_local[(long)(*(int *)(definition_local + 1) + -1) * 3 + 2]->bit_size;
    offset = 0;
    if (callbackfunc_local == (_func_void_coda_cursor_ptr_char_ptr_void_ptr *)0x0) {
      iVar4 = coda_cursor_get_bit_size((coda_cursor *)definition_local,&offset);
      if (iVar4 != 0) {
        return -1;
      }
    }
    else {
      offset = *(long *)callbackfunc_local;
    }
    lVar9 = offset >> 3;
    if ((*(int *)&(*definition_local)->name == 2) &&
       (lVar9 + (int)(uint)((offset & 7U) != 0) < calculated_bit_size)) {
      pcVar1 = definition_local[(long)(*(int *)(definition_local + 1) + -1) * 3 + 2]->size_expr;
      lVar9 = calculated_bit_size - lVar9;
      dst = malloc(lVar9 + 1);
      if (dst == (void *)0x0) {
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",lVar9,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                       ,0x37b);
        return -1;
      }
      iVar4 = read_bytes((coda_product *)*definition_local,(long)&pcVar1->tag + (offset >> 3),lVar9,
                         dst);
      if (iVar4 != 0) {
        free(dst);
        return -1;
      }
      *(undefined1 *)((long)dst + lVar9) = 0;
      error_message_1[0xf8] = '\0';
      error_message_1[0xf9] = '\0';
      error_message_1[0xfa] = '\0';
      error_message_1[0xfb] = '\0';
      error_message_1[0xfc] = '\0';
      error_message_1[0xfd] = '\0';
      error_message_1[0xfe] = '\0';
      error_message_1[0xff] = '\0';
      for (; (long)error_message_1._248_8_ < lVar9;
          error_message_1._248_8_ = error_message_1._248_8_ + 1) {
        if (((*(char *)((long)dst + error_message_1._248_8_) != ' ') &&
            (*(char *)((long)dst + error_message_1._248_8_) != '\t')) &&
           ((*(char *)((long)dst + error_message_1._248_8_) != '\n' &&
            (*(char *)((long)dst + error_message_1._248_8_) != '\r')))) {
          (*_skip_mem_size_check)
                    ((coda_cursor *)definition_local,
                     "non-whitespace trailing data found for xml content",userdata);
          break;
        }
      }
      free(dst);
    }
    else if (lVar9 + (int)(uint)((offset & 7U) != 0) != calculated_bit_size) {
      coda_str64(calculated_bit_size,s2_1 + 0x18);
      coda_str64(offset >> 3,local_708);
      if ((offset & 7U) != 0) {
        sVar10 = strlen(local_708);
        sprintf(local_708 + sVar10,":%d",(ulong)((uint)offset & 7));
      }
      sprintf(s1_1 + 0x18,"incorrect block size (actual size %s does not match calculated size %s)",
              s2_1 + 0x18,local_708);
      (*_skip_mem_size_check)((coda_cursor *)definition_local,s1_1 + 0x18,userdata);
    }
  }
  return 0;
}

Assistant:

static int check_data(coda_cursor *cursor, coda_type **definition, int read_check, int size_check, int64_t *bit_size,
                      void (*callbackfunc)(coda_cursor *, const char *, void *), void *userdata)
{
    coda_type_class type_class;
    int skip_mem_size_check = 0;
    int has_attributes;
    coda_type *type;

    /* even if size_check==0 we need bit_size!=NULL because for some cases sizes are still calculated */
    assert(bit_size != NULL);

    if (coda_cursor_get_type(cursor, &type) != 0)
    {
        return -1;
    }
    if (coda_type_get_class(type, &type_class) != 0)
    {
        return -1;
    }

    /* check definition */
    if (check_definition(cursor, definition, callbackfunc, userdata) != 0)
    {
        return -1;
    }

    /* check bit size */
    if (size_check)
    {
        switch (type_class)
        {
            case coda_array_class:
            case coda_record_class:
            case coda_special_class:
                /* start with size=0 and have traversal below add size of sub element(s) */
                *bit_size = 0;
                break;
            case coda_integer_class:
            case coda_real_class:
            case coda_text_class:
            case coda_raw_class:
                if (coda_cursor_get_bit_size(cursor, bit_size) != 0)
                {
                    return -1;
                }
                break;
        }
    }

    /* try to read data */
    if (read_check)
    {
        switch (type_class)
        {
            case coda_array_class:
            case coda_record_class:
                break;
            case coda_integer_class:
            case coda_real_class:
                {
                    double value;

                    if (coda_cursor_read_double(cursor, &value) != 0)
                    {
                        if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                            coda_errno != CODA_ERROR_INVALID_DATETIME)
                        {
                            return -1;
                        }
                        callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                        /* just continue checking the remaining file */
                    }
                }
                break;
            case coda_text_class:
                {
                    char *data = NULL;
                    long string_length;
                    const char *fixed_value;
                    long fixed_value_length;

                    if (coda_cursor_get_string_length(cursor, &string_length) != 0)
                    {
                        if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                            coda_errno != CODA_ERROR_INVALID_DATETIME)
                        {
                            return -1;
                        }
                        callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                        /* if we can't determine the string length, don't try to read the data */
                        skip_mem_size_check = 1;
                        break;
                    }
                    if (string_length < 0)
                    {
                        callbackfunc(cursor, "string length is negative", userdata);
                        /* if we can't determine a proper string length, don't try to read the data */
                        skip_mem_size_check = 1;
                        break;
                    }

                    if (coda_type_get_fixed_value(*definition != NULL ? *definition : type, &fixed_value,
                                                  &fixed_value_length) != 0)
                    {
                        return -1;
                    }

                    if (string_length > 0)
                    {
                        data = (char *)malloc(string_length + 1);
                        if (data == NULL)
                        {
                            coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                           "out of memory (could not allocate %lu bytes) (%s:%u)", string_length + 1,
                                           __FILE__, __LINE__);
                            return -1;
                        }
                        if (coda_cursor_read_string(cursor, data, string_length + 1) != 0)
                        {
                            free(data);
                            return -1;
                        }
                    }

                    if (fixed_value != NULL)
                    {
                        if (string_length != fixed_value_length)
                        {
                            callbackfunc(cursor, "string data does not match fixed value (length differs)", userdata);
                            /* we do not return -1; we can just continue checking the rest of the file */
                        }
                        else if (string_length > 0)
                        {
                            if (memcmp(data, fixed_value, fixed_value_length) != 0)
                            {
                                callbackfunc(cursor, "string data does not match fixed value", userdata);
                                /* we do not return -1; we can just continue checking the rest of the file */
                            }
                        }
                    }
                    if (((coda_type_text *)type)->special_text_type == ascii_text_line_separator)
                    {
                        switch (((coda_ascii_product *)cursor->product)->end_of_line)
                        {
                            case eol_lf:
                                if (string_length != 1 || data[0] != '\n')
                                {
                                    callbackfunc(cursor, "invalid end of line sequence (expected newline)", userdata);
                                }
                                break;
                            case eol_cr:
                                if (string_length != 1 || data[0] != '\r')
                                {
                                    callbackfunc(cursor, "invalid end of line sequence (expected carriage return)",
                                                 userdata);
                                }
                                break;
                            case eol_crlf:
                                if (string_length != 2 || data[0] != '\r' || data[1] != '\n')
                                {
                                    callbackfunc(cursor, "invalid end of line sequence (expected carriage return "
                                                 "followed by newline)", userdata);
                                }
                                break;
                            case eol_unknown:
                                assert(0);
                                exit(1);
                        }
                    }

                    if (data != NULL)
                    {
                        free(data);
                    }
                }
                break;
            case coda_raw_class:
                {
                    int64_t byte_size;
                    const char *fixed_value;
                    long fixed_value_length;

                    if (!size_check)
                    {
                        if (coda_cursor_get_bit_size(cursor, bit_size) != 0)
                        {
                            if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                                coda_errno != CODA_ERROR_INVALID_DATETIME)
                            {
                                return -1;
                            }
                            callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                            /* if we can't determine the bit size, don't try to read the data */
                            skip_mem_size_check = 1;
                            break;
                        }
                    }
                    if (*bit_size < 0)
                    {
                        callbackfunc(cursor, "bit size is negative", userdata);
                        /* if we can't determine a proper size, don't try to read the data */
                        skip_mem_size_check = 1;
                        break;
                    }
                    byte_size = (*bit_size >> 3) + (*bit_size & 0x7 ? 1 : 0);

                    if (coda_type_get_fixed_value(*definition != NULL ? *definition : type, &fixed_value,
                                                  &fixed_value_length) != 0)
                    {
                        return -1;
                    }
                    if (fixed_value != NULL)
                    {
                        if (byte_size != fixed_value_length)
                        {
                            callbackfunc(cursor, "data does not match fixed value (length differs)", userdata);
                            /* we do not return -1; we can just continue checking the rest of the file */
                        }
                        else if (fixed_value_length > 0)
                        {
                            uint8_t *data;

                            data = (uint8_t *)malloc((size_t)byte_size);
                            if (data == NULL)
                            {
                                coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                               "out of memory (could not allocate %lu bytes) (%s:%u)", (long)byte_size,
                                               __FILE__, __LINE__);
                                return -1;
                            }
                            if (coda_cursor_read_bits(cursor, data, 0, *bit_size) != 0)
                            {
                                free(data);
                                return -1;
                            }
                            if (memcmp(data, fixed_value, fixed_value_length) != 0)
                            {
                                callbackfunc(cursor, "data does not match fixed value (value differs)", userdata);
                                /* we do not return -1; we can just continue checking the rest of the file */
                            }
                            free(data);
                        }
                    }
                }
                break;
            case coda_special_class:
                {
                    coda_special_type special_type;

                    if (coda_cursor_get_special_type(cursor, &special_type) != 0)
                    {
                        return -1;
                    }

                    if (special_type == coda_special_time)
                    {
                        double value;

                        /* try to read the time value as a double */
                        if (coda_cursor_read_double(cursor, &value) != 0)
                        {
                            if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                                coda_errno != CODA_ERROR_INVALID_DATETIME)
                            {
                                return -1;
                            }
                            callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                            /* just continue checking the remaining file */
                        }
                    }
                }
                break;
        }
    }

    /* check attributes */
    if (coda_cursor_has_attributes(cursor, &has_attributes) != 0)
    {
        return -1;
    }
    if (has_attributes)
    {
        coda_type *attributes_definition = NULL;
        int64_t attribute_size;

        if (*definition != NULL)
        {
            if (coda_type_get_attributes(*definition, &attributes_definition) != 0)
            {
                return -1;
            }
        }
        if (coda_cursor_goto_attributes(cursor) != 0)
        {
            return -1;
        }
        if (check_data(cursor, &attributes_definition, read_check, 0, &attribute_size, callbackfunc, userdata) != 0)
        {
            return -1;
        }
        coda_cursor_goto_parent(cursor);
        if (*definition != NULL && attributes_definition == NULL)
        {
            *definition = NULL;
        }
    }

    /* traverse sub-elements */
    if (*definition != NULL || read_check || size_check)
    {
        int64_t sub_bit_size;

        switch (type_class)
        {
            case coda_array_class:
                {
                    coda_type *base_definition = NULL;
                    long num_elements;
                    long i;

                    if (*definition != NULL)
                    {
                        if (coda_type_get_array_base_type(*definition, &base_definition) != 0)
                        {
                            return -1;
                        }
                    }
                    if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
                    {
                        return -1;
                    }
                    if (num_elements > 0)
                    {
                        coda_type *array_element_type;
                        coda_type_class array_element_type_class;
                        coda_format array_element_type_format;

                        if (coda_cursor_goto_first_array_element(cursor) != 0)
                        {
                            return -1;
                        }
                        if (coda_cursor_get_type(cursor, &array_element_type) != 0)
                        {
                            return -1;
                        }
                        if (coda_type_get_class(array_element_type, &array_element_type_class) != 0)
                        {
                            return -1;
                        }
                        if (coda_type_get_format(array_element_type, &array_element_type_format) != 0)
                        {
                            return -1;
                        }
                        if (coda_cursor_get_bit_size(cursor, &sub_bit_size) != 0)
                        {
                            return -1;
                        }
                        /* Reading data element-by-element from a HDF5 datafile takes a long time for large datasets
                         * so for large blocks of integers or doubles in HDF5 format we check the first array element
                         * without reading it and then read the whole array in one action. */
                        if (read_check && array_element_type_format == coda_format_hdf5 && num_elements > 1 &&
                            (array_element_type_class == coda_integer_class ||
                             array_element_type_class == coda_real_class))
                        {
                            double *values;

                            assert(size_check == 0);

                            /* only perform type check for the first array element */
                            if (check_data(cursor, &base_definition, 0, 0, &sub_bit_size, callbackfunc, userdata) != 0)
                            {
                                return -1;
                            }
                            coda_cursor_goto_parent(cursor);

                            values = malloc(num_elements * sizeof(double));
                            if (values == NULL)
                            {
                                coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                               "out of memory (could not allocate %lu bytes) (%s:%u)",
                                               (long)(num_elements * sizeof(double)), __FILE__, __LINE__);
                                return -1;
                            }
                            if (coda_cursor_read_double_array(cursor, values, coda_array_ordering_c) != 0)
                            {
                                if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                                    coda_errno != CODA_ERROR_INVALID_DATETIME)
                                {
                                    return -1;
                                }
                                callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                            }
                            free(values);
                        }
                        else
                        {
                            for (i = 0; i < num_elements; i++)
                            {
                                if (check_data(cursor, &base_definition, read_check, size_check, &sub_bit_size,
                                               callbackfunc, userdata) != 0)
                                {
                                    return -1;
                                }
                                if (size_check)
                                {
                                    *bit_size += sub_bit_size;
                                }
                                if (i < num_elements - 1)
                                {
                                    if (coda_cursor_goto_next_array_element(cursor) != 0)
                                    {
                                        return -1;
                                    }
                                }
                            }
                            coda_cursor_goto_parent(cursor);
                        }
                        if (*definition != NULL && base_definition == NULL)
                        {
                            *definition = NULL;
                        }
                    }
                }
                break;
            case coda_record_class:
                {
                    coda_cursor record_cursor = *cursor;
                    long num_elements;
                    long i;

                    if (coda_cursor_get_num_elements(&record_cursor, &num_elements) != 0)
                    {
                        return -1;
                    }
                    if (num_elements > 0)
                    {
                        if (coda_cursor_goto_first_record_field(cursor) != 0)
                        {
                            return -1;
                        }
                        for (i = 0; i < num_elements; i++)
                        {
                            coda_type *field_definition = NULL;
                            int available;

                            if (coda_cursor_get_record_field_available_status(&record_cursor, i, &available) != 0)
                            {
                                return -1;
                            }
                            if (available)
                            {
                                if (*definition != NULL)
                                {
                                    const char *field_name;
                                    long index;

                                    if (coda_type_get_record_field_name(type, i, &field_name) != 0)
                                    {
                                        return -1;
                                    }
                                    if (coda_type_get_record_field_index_from_name(*definition, field_name, &index) !=
                                        0)
                                    {
                                        /* allow field to not be available in definition -> field_definition=NULL */
                                        coda_errno = 0;
                                    }
                                    else if (coda_type_get_record_field_type(*definition, index, &field_definition) !=
                                             0)
                                    {
                                        return -1;
                                    }
                                }
                                if (check_data(cursor, &field_definition, read_check, size_check, &sub_bit_size,
                                               callbackfunc, userdata) != 0)
                                {
                                    return -1;
                                }
                                if (size_check)
                                {
                                    *bit_size += sub_bit_size;
                                }
                            }
                            if (i < num_elements - 1)
                            {
                                if (coda_cursor_goto_next_record_field(cursor) != 0)
                                {
                                    return -1;
                                }
                            }
                        }
                        coda_cursor_goto_parent(cursor);
                    }
                    if (size_check && ((coda_type_record *)type)->size_expr != NULL)
                    {
                        int64_t fast_size;
                        int prev_option_value = coda_get_option_use_fast_size_expressions();

                        coda_set_option_use_fast_size_expressions(1);
                        if (coda_cursor_get_bit_size(cursor, &fast_size) != 0)
                        {
                            callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                            skip_mem_size_check = 1;
                        }
                        else if (*bit_size != fast_size)
                        {
                            char error_message[256];
                            char s1[30];
                            char s2[30];

                            coda_str64((*bit_size) >> 3, s1);
                            if (*bit_size & 0x7)
                            {
                                sprintf(&s1[strlen(s1)], ":%d", (int)((*bit_size) & 0x7));
                            }
                            coda_str64(fast_size >> 3, s2);
                            if (fast_size & 0x7)
                            {
                                sprintf(&s2[strlen(s2)], ":%d", (int)(fast_size & 0x7));
                            }
                            sprintf(error_message, "invalid result for record size expression (actual record size %s "
                                    "does not match expression result %s)", s1, s2);
                            callbackfunc(cursor, error_message, userdata);
                        }
                        coda_set_option_use_fast_size_expressions(prev_option_value);
                    }
                }
                break;
            case coda_integer_class:
            case coda_real_class:
            case coda_text_class:
            case coda_raw_class:
                break;
            case coda_special_class:
                {
                    coda_special_type special_type;
                    coda_type *base_definition = NULL;

                    if (coda_cursor_get_special_type(cursor, &special_type) != 0)
                    {
                        return -1;
                    }
                    assert(special_type != coda_special_no_data);

                    if (*definition != NULL)
                    {
                        if (coda_type_get_special_base_type(*definition, &base_definition) != 0)
                        {
                            return -1;
                        }
                    }
                    if (coda_cursor_use_base_type_of_special_type(cursor) != 0)
                    {
                        return -1;
                    }
                    if (check_data(cursor, &base_definition, read_check, size_check, bit_size, callbackfunc,
                                   userdata) != 0)
                    {
                        return -1;
                    }
                }
                break;
        }
    }

    /* additional size test for mem backend */
    if (size_check && !skip_mem_size_check && cursor->stack[cursor->n - 1].type->backend == coda_backend_memory)
    {
        if (((coda_mem_type *)cursor->stack[cursor->n - 1].type)->tag == tag_mem_data)
        {
            int64_t expected_byte_size = ((coda_mem_data *)cursor->stack[cursor->n - 1].type)->length;
            int64_t calculated_bit_size = 0;

            if (bit_size != NULL)
            {
                calculated_bit_size = *bit_size;
            }
            else if (coda_cursor_get_bit_size(cursor, &calculated_bit_size) != 0)
            {
                return -1;
            }
            if (cursor->product->format == coda_format_xml &&
                bit_size_to_byte_size(calculated_bit_size) < expected_byte_size)
            {
                long offset = (long)((coda_mem_data *)cursor->stack[cursor->n - 1].type)->offset;
                int64_t byte_size = expected_byte_size - (calculated_bit_size >> 3);
                char *data;
                long i;

                /* verify that trailing data consists of only whitespace */
                data = (char *)malloc((size_t)byte_size + 1);
                if (data == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                   "out of memory (could not allocate %lu bytes) (%s:%u)", (long)byte_size,
                                   __FILE__, __LINE__);
                    return -1;
                }
                if (read_bytes(cursor->product, offset + (calculated_bit_size >> 3), byte_size, (uint8_t *)data) != 0)
                {
                    free(data);
                    return -1;
                }
                data[byte_size] = '\0';
                for (i = 0; i < byte_size; i++)
                {
                    if (data[i] != ' ' && data[i] != '\t' && data[i] != '\n' && data[i] != '\r')
                    {
                        callbackfunc(cursor, "non-whitespace trailing data found for xml content", userdata);
                        break;
                    }
                }
                free(data);
            }
            else if (bit_size_to_byte_size(calculated_bit_size) != expected_byte_size)
            {
                char error_message[256];
                char s1[30];
                char s2[30];

                coda_str64(expected_byte_size, s1);
                coda_str64(calculated_bit_size >> 3, s2);
                if (calculated_bit_size & 0x7)
                {
                    sprintf(&s2[strlen(s2)], ":%d", (int)(calculated_bit_size & 0x7));
                }
                sprintf(error_message, "incorrect block size (actual size %s does not match calculated size %s)",
                        s1, s2);
                callbackfunc(cursor, error_message, userdata);
                /* just continue checking the remaining file */
            }
        }
    }

    return 0;
}